

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mutex_posix.c
# Opt level: O0

int condvar_init(condvar_handle *condvar)

{
  int iVar1;
  pthread_cond_t *ppStack_20;
  int ret;
  condvar_priv *priv;
  condvar_handle *condvar_local;
  
  ppStack_20 = (pthread_cond_t *)condvar->priv;
  if (ppStack_20 == (pthread_cond_t *)0x0) {
    ppStack_20 = (pthread_cond_t *)calloc(1,0x30);
    if (ppStack_20 == (pthread_cond_t *)0x0) {
      return -0xc;
    }
    condvar->priv = ppStack_20;
  }
  iVar1 = pthread_cond_init(ppStack_20,(pthread_condattr_t *)0x0);
  if (iVar1 == 0) {
    condvar_local._4_4_ = 0;
  }
  else {
    condvar_local._4_4_ = -iVar1;
    free(condvar->priv);
    condvar->priv = (void *)0x0;
  }
  return condvar_local._4_4_;
}

Assistant:

int condvar_init(struct condvar_handle *condvar)
{
	struct condvar_priv *priv = condvar->priv;
	int ret;

	if (priv == NULL) {
		priv = calloc(1, sizeof(*priv));
		if (priv == NULL)
			return -ENOMEM;

		condvar->priv = priv;
	}

	ret = pthread_cond_init(&priv->cond, NULL);
	if (ret != 0) {
		ret = -ret;

		goto condvar_init_exit;
	}

	return 0;

condvar_init_exit:
	free(condvar->priv);
	condvar->priv = NULL;

	return ret;
}